

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-bcon-extract.c
# Opt level: O2

void test_double(void)

{
  char cVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  char *pcVar4;
  undefined8 uStack_30;
  double val;
  
  uVar2 = bson_bcon_magic();
  uVar2 = bcon_new(0x3ff199999999999a,0,"foo",uVar2,1,0);
  uVar3 = bson_bcone_magic();
  cVar1 = bcon_extract(uVar2,"foo",uVar3,1,&val,0);
  if (cVar1 == '\0') {
    pcVar4 = "BCON_EXTRACT (bcon, \"foo\", BCONE_DOUBLE (val))";
    uStack_30 = 0x1b;
  }
  else {
    if ((val == 1.1) && (!NAN(val))) {
      bson_destroy(uVar2);
      return;
    }
    pcVar4 = "val == 1.1";
    uStack_30 = 0x1d;
  }
  fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bcon-extract.c"
          ,uStack_30,"test_double",pcVar4);
  abort();
}

Assistant:

static void
test_double (void)
{
   double val;

   bson_t *bcon = BCON_NEW ("foo", BCON_DOUBLE (1.1));

   BSON_ASSERT (BCON_EXTRACT (bcon, "foo", BCONE_DOUBLE (val)));

   BSON_ASSERT (val == 1.1);

   bson_destroy (bcon);
}